

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

SpatialMatrix * RigidBodyDynamics::Math::Xrotx_mat(Scalar *xrot)

{
  double *in_RSI;
  SpatialMatrix *in_RDI;
  Scalar c;
  Scalar s;
  double local_50;
  double local_48;
  double *local_40;
  
  local_40 = in_RSI;
  local_48 = sin(*in_RSI);
  local_50 = cos(*local_40);
  SpatialMatrix_t::SpatialMatrix_t
            ((SpatialMatrix_t *)&stack0xffffffffffffff00,(Scalar *)&stack0xffffffffffffff08,
             (Scalar *)&stack0xffffffffffffff10,(Scalar *)&stack0xffffffffffffff18,
             (Scalar *)&stack0xffffffffffffff20,(Scalar *)&stack0xffffffffffffff28,
             &stack0xffffffffffffffb0,(Scalar *)in_RDI,
             (Scalar *)((ulong)local_48 ^ 0x8000000000000000),(Scalar *)0x0,(Scalar *)0x0,
             (Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,
             (Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x3ff0000000000000,(Scalar *)0x0,(Scalar *)0x0,
             (Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,
             (Scalar *)((ulong)local_48 ^ 0x8000000000000000),(Scalar *)0x0,(Scalar *)0x0,
             (Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0,
             (Scalar *)0x0,(Scalar *)0x0);
  return in_RDI;
}

Assistant:

RBDL_DLLAPI SpatialMatrix Xrotx_mat (const Scalar &xrot) {
  Scalar s, c;
  s = sin (xrot);
  c = cos (xrot);

  return SpatialMatrix(
      1.,    0.,    0.,  0.,  0.,  0.,
      0.,     c,     s,  0.,  0.,  0.,
      0.,    -s,     c,  0.,  0.,  0.,
      0.,    0.,    0.,  1.,  0.,  0.,
      0.,    0.,    0.,  0.,   c,   s,
      0.,    0.,    0.,  0.,  -s,   c
      );
}